

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O2

BinaryOperatorTypes *
soul::TypeRules::getTypesForLogicalOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  ArraySize AVar1;
  ArraySize AVar2;
  
  if (((7 < a->category) || ((200U >> (a->category & 0x1f) & 1) == 0)) &&
     ((7 < b->category || ((200U >> (b->category & 0x1f) & 1) == 0)))) {
    AVar1 = Type::getVectorSize(a);
    AVar2 = Type::getVectorSize(b);
    if (AVar1 == AVar2) {
      (__return_storage_ptr__->resultType).category = primitive;
      (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
      (__return_storage_ptr__->resultType).isRef = false;
      (__return_storage_ptr__->resultType).isConstant = false;
      (__return_storage_ptr__->resultType).primitiveType = bool_;
      (__return_storage_ptr__->resultType).boundingSize = 0;
      (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
      (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
      (__return_storage_ptr__->operandType).category = primitive;
      (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
      (__return_storage_ptr__->operandType).isRef = false;
      (__return_storage_ptr__->operandType).isConstant = false;
      (__return_storage_ptr__->operandType).primitiveType = bool_;
      (__return_storage_ptr__->operandType).boundingSize = 0;
      (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
      (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->operandType).boundingSize = 0;
  (__return_storage_ptr__->operandType).arrayElementBoundingSize = 0;
  (__return_storage_ptr__->operandType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->resultType).structure.object = (Structure *)0x0;
  (__return_storage_ptr__->operandType).category = invalid;
  (__return_storage_ptr__->operandType).arrayElementCategory = invalid;
  (__return_storage_ptr__->operandType).isRef = false;
  (__return_storage_ptr__->operandType).isConstant = false;
  (__return_storage_ptr__->operandType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).category = invalid;
  (__return_storage_ptr__->resultType).arrayElementCategory = invalid;
  (__return_storage_ptr__->resultType).isRef = false;
  (__return_storage_ptr__->resultType).isConstant = false;
  (__return_storage_ptr__->resultType).primitiveType = invalid;
  (__return_storage_ptr__->resultType).boundingSize = 0;
  (__return_storage_ptr__->resultType).arrayElementBoundingSize = 0;
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForLogicalOp (const Type& a, const Type& b)
    {
        if (areTypesSuitableForBinaryOp (a, b) && a.getVectorSize() == b.getVectorSize())
            return { PrimitiveType::bool_, PrimitiveType::bool_ };

        return {};
    }